

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_optimize_ai_lookup.hpp
# Opt level: O0

void __thiscall PatchOptimizeAILookup::load_from_rom(PatchOptimizeAILookup *this,ROM *rom)

{
  uint16_t uVar1;
  reference this_00;
  uint32_t address;
  pair<unsigned_int,_unsigned_int> local_48;
  uint local_40;
  uint16_t local_3a;
  uint32_t jump_destination_B;
  int16_t jump_offset_B;
  uint32_t jump_destination_A;
  uint16_t local_2c;
  int16_t jump_offset_A;
  uint32_t branch_instruction_addr;
  uint16_t enemy_id;
  uint16_t i;
  pair<unsigned_int,_unsigned_int> local_20;
  ROM *local_18;
  ROM *rom_local;
  PatchOptimizeAILookup *this_local;
  
  _enemy_id = 0xffffffff;
  branch_instruction_addr = 0xffffffff;
  local_18 = rom;
  rom_local = (ROM *)this;
  local_20 = std::make_pair<unsigned_int,unsigned_int>((uint *)&enemy_id,&branch_instruction_addr);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::resize(&this->_ai_addrs_for_enemy_id,0xfe,&local_20);
  jump_offset_A = 0;
  while( true ) {
    uVar1 = md::ROM::get_word(local_18,(uint)(ushort)jump_offset_A * 2 + 0x1a8418);
    if (uVar1 == 0xffff) break;
    local_2c = md::ROM::get_word(local_18,(uint)(ushort)jump_offset_A * 2 + 0x1a8418);
    jump_destination_A = (uint)(ushort)jump_offset_A * 8 + 0x1a84a6;
    jump_offset_B = md::ROM::get_word(local_18,(uint)(ushort)jump_offset_A * 8 + 0x1a84a8);
    jump_destination_B = jump_destination_A + 2 + (int)jump_offset_B;
    address = jump_destination_A + 6;
    jump_destination_A = jump_destination_A + 4;
    local_3a = md::ROM::get_word(local_18,address);
    local_40 = jump_destination_A + 2 + (int)(short)local_3a;
    local_48 = std::make_pair<unsigned_int&,unsigned_int&>(&jump_destination_B,&local_40);
    this_00 = std::
              vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              ::operator[](&this->_ai_addrs_for_enemy_id,(ulong)local_2c);
    std::pair<unsigned_int,_unsigned_int>::operator=(this_00,&local_48);
    jump_offset_A = jump_offset_A + 1;
  }
  return;
}

Assistant:

void load_from_rom(const md::ROM& rom) override
    {
        _ai_addrs_for_enemy_id.resize(0xFE, std::make_pair(0xFFFFFFFF, 0xFFFFFFFF));

        uint16_t i = 0;
        while(rom.get_word(offsets::ENEMY_AI_TABLE + (i*2)) != 0xFFFF)
        {
            uint16_t enemy_id = rom.get_word(offsets::ENEMY_AI_TABLE + (i*2));

            uint32_t branch_instruction_addr = offsets::ENEMY_AI_JUMP_TABLE + (i*8);
            int16_t jump_offset_A = (int16_t)rom.get_word(branch_instruction_addr + 2);
            uint32_t jump_destination_A = branch_instruction_addr + 2 + jump_offset_A;

            branch_instruction_addr += 4;
            int16_t jump_offset_B = (int16_t)rom.get_word(branch_instruction_addr + 2);
            uint32_t jump_destination_B = branch_instruction_addr + 2 + jump_offset_B;

            _ai_addrs_for_enemy_id[enemy_id] = std::make_pair(jump_destination_A, jump_destination_B);
            ++i;
        }
    }